

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64assembler.cpp
# Opt level: O0

bool asmjit::v1_14::a64::armCheckMemBaseIndexRel(Mem *mem)

{
  uint uVar1;
  byte bVar2;
  bool local_89;
  RegType indexType;
  RegType baseType;
  uint32_t kIndexMask;
  uint32_t kBaseMask;
  Mem *mem_local;
  
  bVar2 = (byte)((mem->super_BaseMem).super_Operand.super_Operand_._signature._bits >> 3) & 0x1f;
  uVar1 = (mem->super_BaseMem).super_Operand.super_Operand_._signature._bits;
  if ((1 << bVar2 & 0x83U) == 0) {
    local_89 = false;
  }
  else if (bVar2 < 2) {
    local_89 = (uVar1 & 0x1f00) == 0;
  }
  else if ((1 << ((byte)(uVar1 >> 8) & 0x1f) & 0xc1U) == 0) {
    local_89 = false;
  }
  else if ((uVar1 & 0x1f00) == 0) {
    local_89 = true;
  }
  else {
    local_89 = (bool)((((mem->super_BaseMem).super_Operand.super_Operand_._data[1] != 0 ||
                       ((mem->super_BaseMem).super_Operand.super_Operand_._baseId &
                       -(uint)(((mem->super_BaseMem).super_Operand.super_Operand_._signature._bits
                                >> 3 & 0x1f) == 0)) != 0) ^ 0xffU) & 1);
  }
  return local_89;
}

Assistant:

static inline bool armCheckMemBaseIndexRel(const Mem& mem) noexcept {
  // Allowed base types (Nothing, Label, and GpX).
  constexpr uint32_t kBaseMask  = B(0) |
                                  B(RegType::kLabelTag) |
                                  B(RegType::kARM_GpX);

  // Allowed index types (Nothing, GpW, and GpX).
  constexpr uint32_t kIndexMask = B(0) |
                                  B(RegType::kARM_GpW) |
                                  B(RegType::kARM_GpX) ;

  RegType baseType = mem.baseType();
  RegType indexType = mem.indexType();

  if (!Support::bitTest(kBaseMask, baseType))
    return false;

  if (baseType > RegType::kLabelTag) {
    // Index allows either GpW or GpX.
    if (!Support::bitTest(kIndexMask, indexType))
      return false;

    if (indexType == RegType::kNone)
      return true;
    else
      return !mem.hasOffset();
  }
  else {
    // No index register allowed if this is a PC relative address (literal).
    return indexType == RegType::kNone;
  }
}